

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

int __thiscall QSQLiteDriver::close(QSQLiteDriver *this,int __fd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sqlite3_stmt *pStmt;
  QString *descr;
  char cVar5;
  int iVar6;
  sqlite3 *db;
  long lVar7;
  long in_FS_OFFSET;
  QArrayData *local_58 [3];
  Vdbe *local_38;
  
  local_38 = *(Vdbe **)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  cVar5 = (**(code **)(*(long *)this + 0x60))();
  if (cVar5 != '\0') {
    lVar2 = *(long *)(lVar1 + 0xc0);
    if (lVar2 != 0) {
      lVar3 = *(long *)(lVar1 + 0xb8);
      lVar7 = 0;
      do {
        lVar4 = *(long *)(*(long *)(lVar3 + lVar7) + 8);
        pStmt = *(sqlite3_stmt **)(lVar4 + 0xd8);
        if (pStmt != (sqlite3_stmt *)0x0) {
          sqlite3_finalize(pStmt);
          *(undefined8 *)(lVar4 + 0xd8) = 0;
        }
        lVar7 = lVar7 + 8;
      } while (lVar2 << 3 != lVar7);
    }
    db = *(sqlite3 **)(lVar1 + 0xa8);
    if (db == (sqlite3 *)0x0) {
      db = (sqlite3 *)0x0;
    }
    else if (*(long *)(lVar1 + 0xd8) != 0) {
      QList<QString>::clear((QList<QString> *)(lVar1 + 200));
      sqlite3_update_hook(*(sqlite3 **)(lVar1 + 0xa8),
                          (_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)0x0,(void *)0x0)
      ;
      db = *(sqlite3 **)(lVar1 + 0xa8);
    }
    iVar6 = sqlite3_close(db);
    if (iVar6 != 0) {
      descr = *(QString **)(lVar1 + 0xa8);
      QMetaObject::tr((char *)local_58,(char *)&staticMetaObject,0x1ff420);
      qMakeError((sqlite3 *)&stack0xffffffffffffffc0,descr,(ErrorType)local_58,1);
      (**(code **)(*(long *)this + 0x120))(this,(sqlite3 *)&stack0xffffffffffffffc0);
      QSqlError::~QSqlError((QSqlError *)&stack0xffffffffffffffc0);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,0x10);
        }
      }
    }
    *(undefined8 *)(lVar1 + 0xa8) = 0;
    (**(code **)(*(long *)this + 0x110))(this,0);
    (**(code **)(*(long *)this + 0x118))(this,0);
  }
  if (*(Vdbe **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(Vdbe **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteDriver::close()
{
    Q_D(QSQLiteDriver);
    if (isOpen()) {
        for (QSQLiteResult *result : std::as_const(d->results))
            result->d_func()->finalize();

        if (d->access && (d->notificationid.size() > 0)) {
            d->notificationid.clear();
            sqlite3_update_hook(d->access, nullptr, nullptr);
        }

        const int res = sqlite3_close(d->access);

        if (res != SQLITE_OK)
            setLastError(qMakeError(d->access, tr("Error closing database"), QSqlError::ConnectionError, res));
        d->access = nullptr;
        setOpen(false);
        setOpenError(false);
    }
}